

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall State::State(State *this)

{
  _Rb_tree_header *p_Var1;
  
  this->showDemoWindow = true;
  this->tControl_s = 10.0;
  this->tControlNext_s = 0.0;
  this->controlIteration = 0;
  this->curIdControl = -1;
  p_Var1 = &(this->clients)._M_t._M_impl.super__Rb_tree_header;
  (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputEvents).super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputEvents).super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputEvents).super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lastAddText)._M_dataplus._M_p = (pointer)&(this->lastAddText).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->lastAddText,"");
  return;
}

Assistant:

State() {}